

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_load(gz_state *state,uchar *buf,uint len,uint *have)

{
  ssize_t sVar1;
  int *piVar2;
  uint *in_RCX;
  uint in_EDX;
  long in_RSI;
  gz_state *in_RDI;
  ssize_t ret;
  undefined4 in_stack_ffffffffffffffe0;
  int err;
  int local_4;
  
  *in_RCX = 0;
  do {
    sVar1 = read(in_RDI->fd,(void *)(in_RSI + (ulong)*in_RCX),(ulong)(in_EDX - *in_RCX));
    if (sVar1 < 1) break;
    *in_RCX = (int)sVar1 + *in_RCX;
  } while (*in_RCX < in_EDX);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    err = (int)((ulong)in_RSI >> 0x20);
    strerror(*piVar2);
    gz_error(in_RDI,err,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
    local_4 = -1;
  }
  else {
    if (sVar1 == 0) {
      in_RDI->eof = 1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int gz_load(gz_state *state, unsigned char *buf, unsigned len, unsigned *have) {
    ssize_t ret;

    *have = 0;
    do {
        ret = read(state->fd, buf + *have, len - *have);
        if (ret <= 0)
            break;
        *have += (unsigned)ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}